

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip.cpp
# Opt level: O1

void zmq::enable_ipv4_mapping(fd_t s_)

{
  uint in_EAX;
  int iVar1;
  int flag;
  undefined8 uStack_8;
  
  uStack_8 = (ulong)in_EAX;
  iVar1 = setsockopt(s_,0x29,0x1a,(void *)((long)&uStack_8 + 4),4);
  if (iVar1 != 0) {
    enable_ipv4_mapping();
  }
  return;
}

Assistant:

void zmq::enable_ipv4_mapping (fd_t s_)
{
    LIBZMQ_UNUSED (s_);

#if defined IPV6_V6ONLY && !defined ZMQ_HAVE_OPENBSD                           \
  && !defined ZMQ_HAVE_DRAGONFLY
#ifdef ZMQ_HAVE_WINDOWS
    DWORD flag = 0;
#else
    int flag = 0;
#endif
    const int rc = setsockopt (s_, IPPROTO_IPV6, IPV6_V6ONLY,
                               reinterpret_cast<char *> (&flag), sizeof (flag));
#ifdef ZMQ_HAVE_WINDOWS
    wsa_assert (rc != SOCKET_ERROR);
#else
    errno_assert (rc == 0);
#endif
#endif
}